

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O2

rtr_signature_seg * rtr_bgpsec_pop_signature_seg(rtr_bgpsec *bgpsec)

{
  long lVar1;
  rtr_signature_seg *prVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prVar2 = bgpsec->sigs;
  if (prVar2 != (rtr_signature_seg *)0x0) {
    bgpsec->sigs = prVar2->next;
    bgpsec->sigs_len = bgpsec->sigs_len - 1;
    prVar2->next = (rtr_signature_seg *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return prVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_signature_seg *rtr_bgpsec_pop_signature_seg(struct rtr_bgpsec *bgpsec)
{
	struct rtr_signature_seg *tmp = NULL;

	if (!bgpsec->sigs)
		return NULL;

	tmp = bgpsec->sigs;
	bgpsec->sigs = bgpsec->sigs->next;
	bgpsec->sigs_len--;
	tmp->next = NULL;
	return tmp;
}